

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall Chainstate::ReplayBlocks(Chainstate *this)

{
  int height;
  int *args;
  long lVar1;
  Notifications *pNVar2;
  bool bVar3;
  DisconnectResult DVar4;
  CCoinsViewDB *baseIn;
  size_type sVar5;
  mapped_type *pb;
  CBlockIndex *pCVar6;
  CBlockIndex *pCVar7;
  char *fmt;
  CBlockIndex **ppCVar8;
  int iVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  vector<uint256,_std::allocator<uint256>_> hashHeads;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  int local_2b0 [8];
  string local_290;
  CBlock block;
  CCoinsViewCache cache;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock36,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x12f3,false);
  baseIn = CoinsDB(this);
  CCoinsViewCache::CCoinsViewCache(&cache,&baseIn->super_CCoinsView,false);
  (*(baseIn->super_CCoinsView)._vptr_CCoinsView[3])(&hashHeads,baseIn);
  bVar3 = true;
  if (hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start ==
      hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_003689cd;
  if ((long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start == 0x40) {
    pNVar2 = (this->m_chainman->m_options).notifications;
    _((bilingual_str *)&block,(ConstevalStringLiteral)0x6c504b);
    (*pNVar2->_vptr_Notifications[4])(pNVar2,&block,0,0);
    bilingual_str::~bilingual_str((bilingual_str *)&block);
    logging_function._M_str = "ReplayBlocks";
    logging_function._M_len = 0xc;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x1300,ALL,Info,(ConstevalFormatString<0U>)0x6c505f);
    sVar5 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&(this->m_blockman->m_block_index)._M_h,
                    hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if (sVar5 == 0) {
      fmt = "ReplayBlocks(): reorganization to unknown block requested\n";
      iVar9 = 0x1307;
LAB_003689a9:
      logging_function_04._M_str = "ReplayBlocks";
      logging_function_04._M_len = 0xc;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_04._M_len = 0x5e;
      LogPrintFormatInternal<>
                (logging_function_04,source_file_04,iVar9,ALL,Error,(ConstevalFormatString<0U>)fmt);
    }
    else {
      pb = std::__detail::
           _Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->m_blockman->m_block_index,
                        hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start);
      bVar3 = base_blob<256U>::IsNull
                        (&hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[1].super_base_blob<256U>);
      if (bVar3) {
        pCVar7 = (CBlockIndex *)0x0;
        pCVar6 = (mapped_type *)0x0;
      }
      else {
        sVar5 = std::
                _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::count(&(this->m_blockman->m_block_index)._M_h,
                        hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
        if (sVar5 == 0) {
          fmt = "ReplayBlocks(): reorganization from unknown block requested\n";
          iVar9 = 0x130e;
          goto LAB_003689a9;
        }
        pCVar6 = std::__detail::
                 _Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->m_blockman->m_block_index,
                              hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1);
        pCVar7 = LastCommonAncestor(pCVar6,pb);
        if (pCVar7 == (CBlockIndex *)0x0) {
          __assert_fail("pindexFork != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1313,"bool Chainstate::ReplayBlocks()");
        }
      }
      for (; pCVar6 != pCVar7; pCVar6 = pCVar6->pprev) {
        if (0 < pCVar6->nHeight) {
          CBlock::CBlock(&block);
          bVar3 = ::node::BlockManager::ReadBlockFromDisk(this->m_blockman,&block,pCVar6);
          args = &pCVar6->nHeight;
          if (bVar3) {
            CBlockIndex::GetBlockHash((uint256 *)local_2b0,pCVar6);
            base_blob<256u>::ToString_abi_cxx11_(&local_290,(base_blob<256u> *)local_2b0);
            logging_function_01._M_str = "ReplayBlocks";
            logging_function_01._M_len = 0xc;
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_01._M_len = 0x5e;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function_01,source_file_01,0x131e,ALL,Info,
                       (ConstevalFormatString<2U>)0x6c515b,&local_290,args);
            std::__cxx11::string::~string((string *)&local_290);
            DVar4 = DisconnectBlock(this,&block,pCVar6,&cache);
            if (DVar4 != DISCONNECT_FAILED) {
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector(&block.vtx);
              goto LAB_003688be;
            }
            CBlockIndex::GetBlockHash((uint256 *)local_2b0,pCVar6);
            base_blob<256u>::ToString_abi_cxx11_(&local_290,(base_blob<256u> *)local_2b0);
            logging_function_03._M_str = "ReplayBlocks";
            logging_function_03._M_len = 0xc;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_03._M_len = 0x5e;
            LogPrintFormatInternal<int,std::__cxx11::string>
                      (logging_function_03,source_file_03,0x1321,ALL,Error,
                       (ConstevalFormatString<2U>)0x6c5171,args,&local_290);
          }
          else {
            CBlockIndex::GetBlockHash((uint256 *)local_2b0,pCVar6);
            base_blob<256u>::ToString_abi_cxx11_(&local_290,(base_blob<256u> *)local_2b0);
            logging_function_02._M_str = "ReplayBlocks";
            logging_function_02._M_len = 0xc;
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_02._M_len = 0x5e;
            LogPrintFormatInternal<int,std::__cxx11::string>
                      (logging_function_02,source_file_02,0x131b,ALL,Error,
                       (ConstevalFormatString<2U>)0x6c511f,args,&local_290);
          }
          std::__cxx11::string::~string((string *)&local_290);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&block.vtx);
          goto LAB_003689cb;
        }
LAB_003688be:
      }
      if (pCVar7 == (CBlockIndex *)0x0) {
        local_2b0[0] = 0;
        iVar9 = local_2b0[0];
      }
      else {
        local_2b0[0] = pCVar7->nHeight;
        iVar9 = local_2b0[0];
      }
      do {
        height = local_2b0[0] + 1;
        if (pb->nHeight <= local_2b0[0]) {
          local_2b0[0] = height;
          CBlockIndex::GetBlockHash((uint256 *)&block,pb);
          CCoinsViewCache::SetBestBlock(&cache,(uint256 *)&block);
          CCoinsViewCache::Flush(&cache);
          bVar3 = true;
          pNVar2 = (this->m_chainman->m_options).notifications;
          block.super_CBlockHeader._0_8_ =
               block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          block.super_CBlockHeader._32_8_ =
               block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          (*pNVar2->_vptr_Notifications[4])(pNVar2,&block,100,0);
          bilingual_str::~bilingual_str((bilingual_str *)&block);
          goto LAB_003689cd;
        }
        local_2b0[0] = height;
        block.super_CBlockHeader._0_8_ = CBlockIndex::GetAncestor(pb,height);
        ppCVar8 = inline_assertion_check<true,CBlockIndex_const*>
                            ((CBlockIndex **)&block,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                             ,0x132f,"ReplayBlocks","pindexNew->GetAncestor(nHeight)");
        pCVar6 = *ppCVar8;
        CBlockIndex::GetBlockHash((uint256 *)&local_290,pCVar6);
        base_blob<256u>::ToString_abi_cxx11_((string *)&block,(base_blob<256u> *)&local_290);
        logging_function_05._M_str = "ReplayBlocks";
        logging_function_05._M_len = 0xc;
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_05._M_len = 0x5e;
        LogPrintFormatInternal<std::__cxx11::string,int>
                  (logging_function_05,source_file_05,0x1331,ALL,Info,
                   (ConstevalFormatString<2U>)0x6c51c9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block,
                   local_2b0);
        std::__cxx11::string::~string((string *)&block);
        pNVar2 = (this->m_chainman->m_options).notifications;
        _((bilingual_str *)&block,(ConstevalStringLiteral)0x6c504b);
        (*pNVar2->_vptr_Notifications[4])
                  (pNVar2,&block,
                   (ulong)(uint)(int)(((double)(local_2b0[0] - iVar9) * 100.0) /
                                     (double)(pb->nHeight - iVar9)));
        bilingual_str::~bilingual_str((bilingual_str *)&block);
        bVar3 = RollforwardBlock(this,pCVar6,&cache);
      } while (bVar3);
    }
  }
  else {
    logging_function_00._M_str = "ReplayBlocks";
    logging_function_00._M_len = 0xc;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x12fb,ALL,Error,
               (ConstevalFormatString<0U>)0x6c501f);
  }
LAB_003689cb:
  bVar3 = false;
LAB_003689cd:
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&hashHeads.super__Vector_base<uint256,_std::allocator<uint256>_>);
  CCoinsViewCache::~CCoinsViewCache(&cache);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock36.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Chainstate::ReplayBlocks()
{
    LOCK(cs_main);

    CCoinsView& db = this->CoinsDB();
    CCoinsViewCache cache(&db);

    std::vector<uint256> hashHeads = db.GetHeadBlocks();
    if (hashHeads.empty()) return true; // We're already in a consistent state.
    if (hashHeads.size() != 2) {
        LogError("ReplayBlocks(): unknown inconsistent state\n");
        return false;
    }

    m_chainman.GetNotifications().progress(_("Replaying blocks…"), 0, false);
    LogPrintf("Replaying blocks\n");

    const CBlockIndex* pindexOld = nullptr;  // Old tip during the interrupted flush.
    const CBlockIndex* pindexNew;            // New tip during the interrupted flush.
    const CBlockIndex* pindexFork = nullptr; // Latest block common to both the old and the new tip.

    if (m_blockman.m_block_index.count(hashHeads[0]) == 0) {
        LogError("ReplayBlocks(): reorganization to unknown block requested\n");
        return false;
    }
    pindexNew = &(m_blockman.m_block_index[hashHeads[0]]);

    if (!hashHeads[1].IsNull()) { // The old tip is allowed to be 0, indicating it's the first flush.
        if (m_blockman.m_block_index.count(hashHeads[1]) == 0) {
            LogError("ReplayBlocks(): reorganization from unknown block requested\n");
            return false;
        }
        pindexOld = &(m_blockman.m_block_index[hashHeads[1]]);
        pindexFork = LastCommonAncestor(pindexOld, pindexNew);
        assert(pindexFork != nullptr);
    }

    // Rollback along the old branch.
    while (pindexOld != pindexFork) {
        if (pindexOld->nHeight > 0) { // Never disconnect the genesis block.
            CBlock block;
            if (!m_blockman.ReadBlockFromDisk(block, *pindexOld)) {
                LogError("RollbackBlock(): ReadBlockFromDisk() failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            LogPrintf("Rolling back %s (%i)\n", pindexOld->GetBlockHash().ToString(), pindexOld->nHeight);
            DisconnectResult res = DisconnectBlock(block, pindexOld, cache);
            if (res == DISCONNECT_FAILED) {
                LogError("RollbackBlock(): DisconnectBlock failed at %d, hash=%s\n", pindexOld->nHeight, pindexOld->GetBlockHash().ToString());
                return false;
            }
            // If DISCONNECT_UNCLEAN is returned, it means a non-existing UTXO was deleted, or an existing UTXO was
            // overwritten. It corresponds to cases where the block-to-be-disconnect never had all its operations
            // applied to the UTXO set. However, as both writing a UTXO and deleting a UTXO are idempotent operations,
            // the result is still a version of the UTXO set with the effects of that block undone.
        }
        pindexOld = pindexOld->pprev;
    }

    // Roll forward from the forking point to the new tip.
    int nForkHeight = pindexFork ? pindexFork->nHeight : 0;
    for (int nHeight = nForkHeight + 1; nHeight <= pindexNew->nHeight; ++nHeight) {
        const CBlockIndex& pindex{*Assert(pindexNew->GetAncestor(nHeight))};

        LogPrintf("Rolling forward %s (%i)\n", pindex.GetBlockHash().ToString(), nHeight);
        m_chainman.GetNotifications().progress(_("Replaying blocks…"), (int)((nHeight - nForkHeight) * 100.0 / (pindexNew->nHeight - nForkHeight)), false);
        if (!RollforwardBlock(&pindex, cache)) return false;
    }

    cache.SetBestBlock(pindexNew->GetBlockHash());
    cache.Flush();
    m_chainman.GetNotifications().progress(bilingual_str{}, 100, false);
    return true;
}